

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_fclose(mg_file_access *fileacc)

{
  int local_14;
  int ret;
  mg_file_access *fileacc_local;
  
  local_14 = -1;
  if (fileacc != (mg_file_access *)0x0) {
    if (fileacc->fp != (FILE *)0x0) {
      local_14 = fclose((FILE *)fileacc->fp);
    }
    memset(fileacc,0,8);
  }
  return local_14;
}

Assistant:

static int
mg_fclose(struct mg_file_access *fileacc)
{
	int ret = -1;
	if (fileacc != NULL) {
		if (fileacc->fp != NULL) {
			ret = fclose(fileacc->fp);
		}
		/* reset all members of fileacc */
		memset(fileacc, 0, sizeof(*fileacc));
	}
	return ret;
}